

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetGlyphSVG(stbtt_fontinfo *info,int gl,char **svg)

{
  int iVar1;
  uchar *puVar2;
  stbtt_uint32 sVar3;
  uchar *puVar4;
  stbtt_uint8 *svg_doc;
  stbtt_uint8 *data;
  char **svg_local;
  int gl_local;
  stbtt_fontinfo *info_local;
  
  puVar2 = info->data;
  if (info->svg == 0) {
    info_local._4_4_ = 0;
  }
  else {
    puVar4 = stbtt_FindSVGDoc(info,gl);
    if (puVar4 == (uchar *)0x0) {
      info_local._4_4_ = 0;
    }
    else {
      iVar1 = info->svg;
      sVar3 = ttULONG(puVar4 + 4);
      *svg = (char *)(puVar2 + (ulong)sVar3 + (long)iVar1);
      info_local._4_4_ = ttULONG(puVar4 + 8);
    }
  }
  return info_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphSVG(const stbtt_fontinfo *info, int gl, const char **svg)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint8 *svg_doc;

   if (info->svg == 0)
      return 0;

   svg_doc = stbtt_FindSVGDoc(info, gl);
   if (svg_doc != NULL) {
      *svg = (char *) data + info->svg + ttULONG(svg_doc + 4);
      return ttULONG(svg_doc + 8);
   } else {
      return 0;
   }
}